

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType targetType;
  iterator iVar2;
  cmake *this_00;
  string *psVar3;
  OutputInfo *pOVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_bool>
  pVar5;
  allocator<char> local_141;
  string config_upper;
  undefined1 local_120 [32];
  OutputInfo info;
  value_type entry;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return (OutputInfo *)0x0;
  }
  bVar1 = HaveWellDefinedOutputFiles(this);
  if (!bVar1) {
    entry.first._M_dataplus._M_p = (pointer)0x2c;
    entry.first._M_string_length = (size_type)anon_var_dwarf_12c263d;
    psVar3 = GetName_abi_cxx11_(this);
    info.OutDir._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    info.OutDir._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    targetType = GetType(this);
    psVar3 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    cmStrCat<char[17],std::__cxx11::string>
              (&config_upper,(cmAlphaNum *)&entry,(cmAlphaNum *)&info,
               (char (*) [17])" which has type ",psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&config_upper);
    std::__cxx11::string::~string((string *)&config_upper);
    return (OutputInfo *)0x0;
  }
  config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
  config_upper._M_string_length = 0;
  config_upper.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&entry.first,config);
    std::__cxx11::string::operator=((string *)&config_upper,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
          ::find(&(this->OutputInfoMap)._M_t,&config_upper);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header)
  {
    info.OutDir._M_dataplus._M_p = (pointer)&info.OutDir.field_2;
    info.OutDir._M_string_length = 0;
    info.OutDir.field_2._M_local_buf[0] = '\0';
    info.ImpDir._M_dataplus._M_p = (pointer)&info.ImpDir.field_2;
    info.ImpDir._M_string_length = 0;
    info.ImpDir.field_2._M_local_buf[0] = '\0';
    info.PdbDir._M_dataplus._M_p = (pointer)&info.PdbDir.field_2;
    info.PdbDir._M_string_length = 0;
    info.PdbDir.field_2._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              (&entry,&config_upper,&info);
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                        *)&this->OutputInfoMap,&entry);
    iVar2._M_node = (_Base_ptr)pVar5.first._M_node;
    ComputeOutputDir(this,config,RuntimeBinaryArtifact,&info.OutDir);
    ComputeOutputDir(this,config,ImportLibraryArtifact,&info.ImpDir);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"PDB",&local_141);
    bVar1 = ComputePDBOutputDir(this,(string *)local_120,config,&info.PdbDir);
    std::__cxx11::string::~string((string *)local_120);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)&info.PdbDir);
    }
    OutputInfo::operator=((OutputInfo *)(iVar2._M_node + 2),&info);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::~pair(&entry);
    OutputInfo::~OutputInfo(&info);
  }
  else {
    bVar1 = OutputInfo::empty((OutputInfo *)(iVar2._M_node + 2));
    if (bVar1) {
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      psVar3 = GetName_abi_cxx11_(this);
      std::operator+(&info.OutDir,"Target \'",psVar3);
      std::operator+(&entry.first,&info.OutDir,"\' OUTPUT_DIRECTORY depends on itself.");
      GetBacktrace((cmGeneratorTarget *)local_120);
      cmake::IssueMessage(this_00,FATAL_ERROR,&entry.first,(cmListFileBacktrace *)local_120);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
      std::__cxx11::string::~string((string *)&entry);
      std::__cxx11::string::~string((string *)&info);
      pOVar4 = (OutputInfo *)0x0;
      goto LAB_0038ba47;
    }
  }
  pOVar4 = (OutputInfo *)(iVar2._M_node + 2);
LAB_0038ba47:
  std::__cxx11::string::~string((string *)&config_upper);
  return pOVar4;
}

Assistant:

cmGeneratorTarget::OutputInfo const* cmGeneratorTarget::GetOutputInfo(
  const std::string& config) const
{
  // There is no output information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  // Only libraries and executables have well-defined output files.
  if (!this->HaveWellDefinedOutputFiles()) {
    std::string msg = cmStrCat("cmGeneratorTarget::GetOutputInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->OutputInfoMap.find(config_upper);
  if (i == this->OutputInfoMap.end()) {
    // Add empty info in map to detect potential recursion.
    OutputInfo info;
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->OutputInfoMap.insert(entry).first;

    // Compute output directories.
    this->ComputeOutputDir(config, cmStateEnums::RuntimeBinaryArtifact,
                           info.OutDir);
    this->ComputeOutputDir(config, cmStateEnums::ImportLibraryArtifact,
                           info.ImpDir);
    if (!this->ComputePDBOutputDir("PDB", config, info.PdbDir)) {
      info.PdbDir = info.OutDir;
    }

    // Now update the previously-prepared map entry.
    i->second = info;
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_DIRECTORY depends on itself.",
      this->GetBacktrace());
    return nullptr;
  }
  return &i->second;
}